

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->magic,buffer,size);
  if (TVar1 == 0) {
    TVar1 = UINT16_Unmarshal(&target->type,buffer,size);
    if (TVar1 == 0) {
      TVar1 = TPM2B_NAME_Unmarshal(&target->qualifiedSigner,buffer,size);
      if (TVar1 == 0) {
        TVar1 = TPM2B_DATA_Unmarshal(&target->extraData,buffer,size);
        if (TVar1 == 0) {
          TVar1 = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size);
          if (TVar1 == 0) {
            TVar1 = UINT64_Unmarshal(&target->firmwareVersion,buffer,size);
            if (TVar1 == 0) {
              TVar1 = TPMU_ATTEST_Unmarshal(&target->attested,buffer,size,(uint)target->type);
              return TVar1;
            }
          }
        }
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_GENERATED_Unmarshal((TPM_GENERATED *)&(target->magic), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ST_ATTEST_Unmarshal((TPMI_ST_ATTEST *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->qualifiedSigner), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->extraData), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT64_Unmarshal((UINT64 *)&(target->firmwareVersion), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_ATTEST_Unmarshal((TPMU_ATTEST *)&(target->attested), buffer, size, (UINT32)target->type);
    return result;
}